

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Transformation * __thiscall
TransformParser::parse(Transformation *__return_storage_ptr__,TransformParser *this)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  size_t sVar8;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  float extraout_XMM0_Db_07;
  float extraout_XMM0_Db_08;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float extraout_XMM0_Dc_03;
  float extraout_XMM0_Dc_04;
  float extraout_XMM0_Dc_05;
  float extraout_XMM0_Dc_06;
  float extraout_XMM0_Dc_07;
  float extraout_XMM0_Dc_08;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  float extraout_XMM0_Dd_06;
  float extraout_XMM0_Dd_07;
  float extraout_XMM0_Dd_08;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  StringView local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  string local_50;
  
  __return_storage_ptr__->a = 1.0;
  __return_storage_ptr__->b = 0.0;
  __return_storage_ptr__->c = 0.0;
  __return_storage_ptr__->d = 1.0;
  __return_storage_ptr__->e = 0.0;
  __return_storage_ptr__->f = 0.0;
  sVar8 = (this->super_Parser).s.size;
  if (sVar8 != 0) {
    pbVar3 = (byte *)(this->super_Parser).s.s;
    do {
      sVar8 = sVar8 - 1;
      local_f8.s = (this->super_Parser).s.s;
      local_f8.size = (this->super_Parser).s.size;
      bVar1 = *pbVar3;
      (this->super_Parser).s.s = (char *)(pbVar3 + 1);
      (this->super_Parser).s.size = sVar8;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = local_f8.s;
        (this->super_Parser).s.size = local_f8.size;
        if ((this->super_Parser).s.size == 0) {
          return __return_storage_ptr__;
        }
        fVar11 = 1.0;
        fVar12 = 0.0;
        fStack_c0 = 0.0;
        fStack_bc = 0.0;
        local_b8 = 0.0;
        fStack_b4 = 0.0;
        fStack_b0 = 0.0;
        fStack_ac = 1.0;
        goto LAB_00107a8c;
      }
      pbVar3 = pbVar3 + 1;
    } while (sVar8 != 0);
  }
  return __return_storage_ptr__;
LAB_00107a8c:
  local_c8 = fVar11;
  fStack_c4 = fVar12;
  bVar7 = Parser::parse(&this->super_Parser,"matrix");
  if (!bVar7) {
    bVar7 = Parser::parse(&this->super_Parser,"translate");
    if (!bVar7) {
      bVar7 = Parser::parse(&this->super_Parser,"scale");
      if (!bVar7) {
        bVar7 = Parser::parse(&this->super_Parser,"rotate");
        if (!bVar7) {
          bVar7 = Parser::parse(&this->super_Parser,"skewX");
          if (bVar7) {
            sVar8 = (this->super_Parser).s.size;
            if (sVar8 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar8 = sVar8 - 1;
                pcVar4 = (this->super_Parser).s.s;
                sVar5 = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar8;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = pcVar4;
                  (this->super_Parser).s.size = sVar5;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar8 != 0);
            }
            local_f8.s = "(";
            local_f8.size = 1;
            Parser::expect(&this->super_Parser,&local_f8);
            sVar8 = (this->super_Parser).s.size;
            if (sVar8 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar8 = sVar8 - 1;
                local_f8.s = (this->super_Parser).s.s;
                local_f8.size = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar8;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = local_f8.s;
                  (this->super_Parser).s.size = local_f8.size;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar8 != 0);
            }
            local_e8 = Parser::parse_number(&this->super_Parser);
            local_e8 = local_e8 * 0.017453292;
            sVar8 = (this->super_Parser).s.size;
            if (sVar8 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar8 = sVar8 - 1;
                pcVar4 = (this->super_Parser).s.s;
                sVar5 = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar8;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = pcVar4;
                  (this->super_Parser).s.size = sVar5;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar8 != 0);
            }
            local_f8.s = ")";
            local_f8.size = 1;
            Parser::expect(&this->super_Parser,&local_f8);
            fVar9 = tanf(local_e8);
            fVar11 = local_c8 + fVar9 * fStack_b0;
            fVar12 = fStack_c4 + fVar9 * fStack_ac;
            fStack_c0 = fStack_c0 + fVar9 * fStack_b0;
            fStack_bc = fStack_bc + fVar9 * fStack_ac;
            local_b8 = local_b8 + fStack_b0 * 0.0 + local_c8 * 0.0;
            fStack_b4 = fStack_b4 + fStack_ac * 0.0 + fStack_c4 * 0.0;
            fStack_b0 = fStack_b0 + local_c8 * 0.0;
            fStack_ac = fStack_ac + fStack_c4 * 0.0;
            __return_storage_ptr__->a = fStack_ac;
            __return_storage_ptr__->b = fStack_b0;
            __return_storage_ptr__->c = fVar12;
            __return_storage_ptr__->d = fVar11;
            __return_storage_ptr__->e = fStack_b4;
            __return_storage_ptr__->f = local_b8;
          }
          else {
            bVar7 = Parser::parse(&this->super_Parser,"skewY");
            if (!bVar7) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"unexpected transformation","");
              Parser::error(&this->super_Parser,&local_50);
            }
            sVar8 = (this->super_Parser).s.size;
            if (sVar8 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar8 = sVar8 - 1;
                pcVar4 = (this->super_Parser).s.s;
                sVar5 = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar8;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = pcVar4;
                  (this->super_Parser).s.size = sVar5;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar8 != 0);
            }
            local_f8.s = "(";
            local_f8.size = 1;
            Parser::expect(&this->super_Parser,&local_f8);
            sVar8 = (this->super_Parser).s.size;
            if (sVar8 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar8 = sVar8 - 1;
                local_f8.s = (this->super_Parser).s.s;
                local_f8.size = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar8;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = local_f8.s;
                  (this->super_Parser).s.size = local_f8.size;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar8 != 0);
            }
            local_e8 = Parser::parse_number(&this->super_Parser);
            local_e8 = local_e8 * 0.017453292;
            sVar8 = (this->super_Parser).s.size;
            if (sVar8 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar8 = sVar8 - 1;
                pcVar4 = (this->super_Parser).s.s;
                sVar5 = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar8;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = pcVar4;
                  (this->super_Parser).s.size = sVar5;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar8 != 0);
            }
            local_f8.s = ")";
            local_f8.size = 1;
            Parser::expect(&this->super_Parser,&local_f8);
            fVar9 = tanf(local_e8);
            fVar11 = fStack_b0 * 0.0 + local_c8;
            fVar12 = fStack_ac * 0.0 + fStack_c4;
            fStack_c0 = fStack_b0 * 0.0 + fStack_c0;
            fStack_bc = fStack_ac * 0.0 + fStack_bc;
            local_b8 = local_b8 + local_c8 * 0.0 + fStack_b0 * 0.0;
            fStack_b4 = fStack_b4 + fStack_c4 * 0.0 + fStack_ac * 0.0;
            fStack_b0 = fStack_b0 + fVar9 * local_c8;
            fStack_ac = fStack_ac + fVar9 * fStack_c4;
            __return_storage_ptr__->a = fStack_ac;
            __return_storage_ptr__->b = fStack_b0;
            __return_storage_ptr__->c = fVar12;
            __return_storage_ptr__->d = fVar11;
            __return_storage_ptr__->e = fStack_b4;
            __return_storage_ptr__->f = local_b8;
          }
          goto LAB_0010883b;
        }
        sVar8 = (this->super_Parser).s.size;
        if (sVar8 != 0) {
          pbVar3 = (byte *)(this->super_Parser).s.s;
          do {
            sVar8 = sVar8 - 1;
            pcVar4 = (this->super_Parser).s.s;
            sVar5 = (this->super_Parser).s.size;
            bVar1 = *pbVar3;
            (this->super_Parser).s.s = (char *)(pbVar3 + 1);
            (this->super_Parser).s.size = sVar8;
            if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
              (this->super_Parser).s.s = pcVar4;
              (this->super_Parser).s.size = sVar5;
              break;
            }
            pbVar3 = pbVar3 + 1;
          } while (sVar8 != 0);
        }
        local_f8.s = "(";
        local_f8.size = 1;
        Parser::expect(&this->super_Parser,&local_f8);
        sVar8 = (this->super_Parser).s.size;
        if (sVar8 != 0) {
          pbVar3 = (byte *)(this->super_Parser).s.s;
          do {
            sVar8 = sVar8 - 1;
            local_f8.s = (this->super_Parser).s.s;
            local_f8.size = (this->super_Parser).s.size;
            bVar1 = *pbVar3;
            (this->super_Parser).s.s = (char *)(pbVar3 + 1);
            (this->super_Parser).s.size = sVar8;
            if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
              (this->super_Parser).s.s = local_f8.s;
              (this->super_Parser).s.size = local_f8.size;
              break;
            }
            pbVar3 = pbVar3 + 1;
          } while (sVar8 != 0);
        }
        local_a8 = Parser::parse_number(&this->super_Parser);
        local_a8 = local_a8 * 0.017453292;
        sVar8 = (this->super_Parser).s.size;
        if (sVar8 != 0) {
          pbVar3 = (byte *)(this->super_Parser).s.s;
          do {
            sVar8 = sVar8 - 1;
            local_f8.s = (this->super_Parser).s.s;
            local_f8.size = (this->super_Parser).s.size;
            bVar1 = *pbVar3;
            (this->super_Parser).s.s = (char *)(pbVar3 + 1);
            (this->super_Parser).s.size = sVar8;
            if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
              (this->super_Parser).s.s = local_f8.s;
              (this->super_Parser).s.size = local_f8.size;
              if (((this->super_Parser).s.size != 0) &&
                 (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10)) {
                local_d8 = Parser::parse_number(&this->super_Parser);
                sVar8 = (this->super_Parser).s.size;
                if (sVar8 == 0) goto LAB_0010855c;
                pbVar3 = (byte *)(this->super_Parser).s.s;
                goto LAB_0010852d;
              }
              break;
            }
            pbVar3 = pbVar3 + 1;
          } while (sVar8 != 0);
        }
        local_e8 = cosf(local_a8);
        fVar11 = sinf(local_a8);
        fStack_d0 = fStack_b0 * local_e8 + fVar11 * local_c8;
        fStack_cc = fStack_ac * local_e8 + fVar11 * fStack_c4;
        fVar14 = local_e8 * local_c8 - fVar11 * fStack_b0;
        fVar15 = local_e8 * fStack_c4 - fVar11 * fStack_ac;
        fStack_e0 = local_e8 * fStack_c0 - fVar11 * fStack_b0;
        fStack_dc = local_e8 * fStack_bc - fVar11 * fStack_ac;
        local_d8 = fStack_b0 * 0.0 + local_c8 * 0.0 + local_b8;
        fStack_d4 = fStack_ac * 0.0 + fStack_c4 * 0.0 + fStack_b4;
        goto LAB_00108497;
      }
      sVar8 = (this->super_Parser).s.size;
      if (sVar8 != 0) {
        pbVar3 = (byte *)(this->super_Parser).s.s;
        do {
          sVar8 = sVar8 - 1;
          pcVar4 = (this->super_Parser).s.s;
          sVar5 = (this->super_Parser).s.size;
          bVar1 = *pbVar3;
          (this->super_Parser).s.s = (char *)(pbVar3 + 1);
          (this->super_Parser).s.size = sVar8;
          if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
            (this->super_Parser).s.s = pcVar4;
            (this->super_Parser).s.size = sVar5;
            break;
          }
          pbVar3 = pbVar3 + 1;
        } while (sVar8 != 0);
      }
      local_f8.s = "(";
      local_f8.size = 1;
      Parser::expect(&this->super_Parser,&local_f8);
      sVar8 = (this->super_Parser).s.size;
      if (sVar8 != 0) {
        pbVar3 = (byte *)(this->super_Parser).s.s;
        do {
          sVar8 = sVar8 - 1;
          local_f8.s = (this->super_Parser).s.s;
          local_f8.size = (this->super_Parser).s.size;
          bVar1 = *pbVar3;
          (this->super_Parser).s.s = (char *)(pbVar3 + 1);
          (this->super_Parser).s.size = sVar8;
          if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
            (this->super_Parser).s.s = local_f8.s;
            (this->super_Parser).s.size = local_f8.size;
            break;
          }
          pbVar3 = pbVar3 + 1;
        } while (sVar8 != 0);
      }
      fVar10 = Parser::parse_number(&this->super_Parser);
      sVar8 = (this->super_Parser).s.size;
      fVar11 = extraout_XMM0_Db_06;
      fVar12 = extraout_XMM0_Dc_06;
      fVar9 = extraout_XMM0_Dd_06;
      local_e8 = fVar10;
      fStack_e4 = extraout_XMM0_Db_06;
      fStack_e0 = extraout_XMM0_Dc_06;
      fStack_dc = extraout_XMM0_Dd_06;
      if (sVar8 != 0) {
        pbVar3 = (byte *)(this->super_Parser).s.s;
        do {
          sVar8 = sVar8 - 1;
          local_f8.s = (this->super_Parser).s.s;
          local_f8.size = (this->super_Parser).s.size;
          bVar1 = *pbVar3;
          (this->super_Parser).s.s = (char *)(pbVar3 + 1);
          (this->super_Parser).s.size = sVar8;
          if ((0x2c < (ulong)bVar1) || ((0x100100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
            (this->super_Parser).s.s = local_f8.s;
            (this->super_Parser).s.size = local_f8.size;
            if (((this->super_Parser).s.size != 0) &&
               (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10)) {
              fVar10 = Parser::parse_number(&this->super_Parser);
              sVar8 = (this->super_Parser).s.size;
              fVar11 = extraout_XMM0_Db_07;
              fVar12 = extraout_XMM0_Dc_07;
              fVar9 = extraout_XMM0_Dd_07;
              if (sVar8 != 0) {
                pbVar3 = (byte *)(this->super_Parser).s.s;
                goto LAB_0010833f;
              }
            }
            break;
          }
          pbVar3 = pbVar3 + 1;
        } while (sVar8 != 0);
      }
      goto LAB_00108267;
    }
    sVar8 = (this->super_Parser).s.size;
    if (sVar8 != 0) {
      pbVar3 = (byte *)(this->super_Parser).s.s;
      do {
        sVar8 = sVar8 - 1;
        pcVar4 = (this->super_Parser).s.s;
        sVar5 = (this->super_Parser).s.size;
        bVar1 = *pbVar3;
        (this->super_Parser).s.s = (char *)(pbVar3 + 1);
        (this->super_Parser).s.size = sVar8;
        if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          (this->super_Parser).s.s = pcVar4;
          (this->super_Parser).s.size = sVar5;
          break;
        }
        pbVar3 = pbVar3 + 1;
      } while (sVar8 != 0);
    }
    local_f8.s = "(";
    local_f8.size = 1;
    Parser::expect(&this->super_Parser,&local_f8);
    sVar8 = (this->super_Parser).s.size;
    if (sVar8 != 0) {
      pbVar3 = (byte *)(this->super_Parser).s.s;
      do {
        sVar8 = sVar8 - 1;
        local_f8.s = (this->super_Parser).s.s;
        local_f8.size = (this->super_Parser).s.size;
        bVar1 = *pbVar3;
        (this->super_Parser).s.s = (char *)(pbVar3 + 1);
        (this->super_Parser).s.size = sVar8;
        if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          (this->super_Parser).s.s = local_f8.s;
          (this->super_Parser).s.size = local_f8.size;
          break;
        }
        pbVar3 = pbVar3 + 1;
      } while (sVar8 != 0);
    }
    local_e8 = Parser::parse_number(&this->super_Parser);
    sVar8 = (this->super_Parser).s.size;
    fVar10 = 0.0;
    fVar11 = 0.0;
    fVar12 = 0.0;
    fVar9 = 0.0;
    fStack_e4 = extraout_XMM0_Db_04;
    fStack_e0 = extraout_XMM0_Dc_04;
    fStack_dc = extraout_XMM0_Dd_04;
    if (sVar8 != 0) {
      pbVar3 = (byte *)(this->super_Parser).s.s;
      do {
        sVar8 = sVar8 - 1;
        local_f8.s = (this->super_Parser).s.s;
        local_f8.size = (this->super_Parser).s.size;
        bVar1 = *pbVar3;
        (this->super_Parser).s.s = (char *)(pbVar3 + 1);
        (this->super_Parser).s.size = sVar8;
        if ((0x2c < (ulong)bVar1) || ((0x100100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          (this->super_Parser).s.s = local_f8.s;
          (this->super_Parser).s.size = local_f8.size;
          if (((this->super_Parser).s.size != 0) &&
             (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10)) {
            fVar10 = Parser::parse_number(&this->super_Parser);
            sVar8 = (this->super_Parser).s.size;
            fVar11 = extraout_XMM0_Db_05;
            fVar12 = extraout_XMM0_Dc_05;
            fVar9 = extraout_XMM0_Dd_05;
            if (sVar8 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              goto LAB_00108177;
            }
          }
          break;
        }
        pbVar3 = pbVar3 + 1;
      } while (sVar8 != 0);
    }
    goto LAB_00108049;
  }
  sVar8 = (this->super_Parser).s.size;
  if (sVar8 != 0) {
    pbVar3 = (byte *)(this->super_Parser).s.s;
    do {
      sVar8 = sVar8 - 1;
      pcVar4 = (this->super_Parser).s.s;
      sVar5 = (this->super_Parser).s.size;
      bVar1 = *pbVar3;
      (this->super_Parser).s.s = (char *)(pbVar3 + 1);
      (this->super_Parser).s.size = sVar8;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = pcVar4;
        (this->super_Parser).s.size = sVar5;
        break;
      }
      pbVar3 = pbVar3 + 1;
    } while (sVar8 != 0);
  }
  local_f8.s = "(";
  local_f8.size = 1;
  Parser::expect(&this->super_Parser,&local_f8);
  sVar8 = (this->super_Parser).s.size;
  if (sVar8 != 0) {
    pbVar3 = (byte *)(this->super_Parser).s.s;
    do {
      sVar8 = sVar8 - 1;
      local_f8.s = (this->super_Parser).s.s;
      local_f8.size = (this->super_Parser).s.size;
      bVar1 = *pbVar3;
      (this->super_Parser).s.s = (char *)(pbVar3 + 1);
      (this->super_Parser).s.size = sVar8;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = local_f8.s;
        (this->super_Parser).s.size = local_f8.size;
        break;
      }
      pbVar3 = pbVar3 + 1;
    } while (sVar8 != 0);
  }
  local_e8 = Parser::parse_number(&this->super_Parser);
  sVar8 = (this->super_Parser).s.size;
  if (sVar8 != 0) {
    pbVar3 = (byte *)(this->super_Parser).s.s;
    do {
      sVar8 = sVar8 - 1;
      local_f8.s = (this->super_Parser).s.s;
      local_f8.size = (this->super_Parser).s.size;
      bVar1 = *pbVar3;
      (this->super_Parser).s.s = (char *)(pbVar3 + 1);
      (this->super_Parser).s.size = sVar8;
      if ((0x2c < (ulong)bVar1) || ((0x100100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = local_f8.s;
        (this->super_Parser).s.size = local_f8.size;
        break;
      }
      pbVar3 = pbVar3 + 1;
    } while (sVar8 != 0);
  }
  fStack_e4 = extraout_XMM0_Db;
  fStack_e0 = extraout_XMM0_Dc;
  fStack_dc = extraout_XMM0_Dd;
  local_d8 = Parser::parse_number(&this->super_Parser);
  sVar8 = (this->super_Parser).s.size;
  if (sVar8 != 0) {
    pbVar3 = (byte *)(this->super_Parser).s.s;
    do {
      sVar8 = sVar8 - 1;
      local_f8.s = (this->super_Parser).s.s;
      local_f8.size = (this->super_Parser).s.size;
      bVar1 = *pbVar3;
      (this->super_Parser).s.s = (char *)(pbVar3 + 1);
      (this->super_Parser).s.size = sVar8;
      if ((0x2c < (ulong)bVar1) || ((0x100100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = local_f8.s;
        (this->super_Parser).s.size = local_f8.size;
        break;
      }
      pbVar3 = pbVar3 + 1;
    } while (sVar8 != 0);
  }
  fStack_d4 = extraout_XMM0_Db_00;
  fStack_d0 = extraout_XMM0_Dc_00;
  fStack_cc = extraout_XMM0_Dd_00;
  local_a8 = Parser::parse_number(&this->super_Parser);
  sVar8 = (this->super_Parser).s.size;
  if (sVar8 != 0) {
    pbVar3 = (byte *)(this->super_Parser).s.s;
    do {
      sVar8 = sVar8 - 1;
      local_f8.s = (this->super_Parser).s.s;
      local_f8.size = (this->super_Parser).s.size;
      bVar1 = *pbVar3;
      (this->super_Parser).s.s = (char *)(pbVar3 + 1);
      (this->super_Parser).s.size = sVar8;
      if ((0x2c < (ulong)bVar1) || ((0x100100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = local_f8.s;
        (this->super_Parser).s.size = local_f8.size;
        break;
      }
      pbVar3 = pbVar3 + 1;
    } while (sVar8 != 0);
  }
  local_78 = Parser::parse_number(&this->super_Parser);
  sVar8 = (this->super_Parser).s.size;
  if (sVar8 != 0) {
    pbVar3 = (byte *)(this->super_Parser).s.s;
    do {
      sVar8 = sVar8 - 1;
      local_f8.s = (this->super_Parser).s.s;
      local_f8.size = (this->super_Parser).s.size;
      bVar1 = *pbVar3;
      (this->super_Parser).s.s = (char *)(pbVar3 + 1);
      (this->super_Parser).s.size = sVar8;
      if ((0x2c < (ulong)bVar1) || ((0x100100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = local_f8.s;
        (this->super_Parser).s.size = local_f8.size;
        break;
      }
      pbVar3 = pbVar3 + 1;
    } while (sVar8 != 0);
  }
  fStack_74 = extraout_XMM0_Db_01;
  fStack_70 = extraout_XMM0_Dc_01;
  fStack_6c = extraout_XMM0_Dd_01;
  local_88 = Parser::parse_number(&this->super_Parser);
  sVar8 = (this->super_Parser).s.size;
  if (sVar8 != 0) {
    pbVar3 = (byte *)(this->super_Parser).s.s;
    do {
      sVar8 = sVar8 - 1;
      local_f8.s = (this->super_Parser).s.s;
      local_f8.size = (this->super_Parser).s.size;
      bVar1 = *pbVar3;
      (this->super_Parser).s.s = (char *)(pbVar3 + 1);
      (this->super_Parser).s.size = sVar8;
      if ((0x2c < (ulong)bVar1) || ((0x100100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = local_f8.s;
        (this->super_Parser).s.size = local_f8.size;
        break;
      }
      pbVar3 = pbVar3 + 1;
    } while (sVar8 != 0);
  }
  fStack_84 = extraout_XMM0_Db_02;
  fStack_80 = extraout_XMM0_Dc_02;
  fStack_7c = extraout_XMM0_Dd_02;
  local_98 = Parser::parse_number(&this->super_Parser);
  sVar8 = (this->super_Parser).s.size;
  if (sVar8 != 0) {
    pbVar3 = (byte *)(this->super_Parser).s.s;
    do {
      sVar8 = sVar8 - 1;
      pcVar4 = (this->super_Parser).s.s;
      sVar5 = (this->super_Parser).s.size;
      bVar1 = *pbVar3;
      (this->super_Parser).s.s = (char *)(pbVar3 + 1);
      (this->super_Parser).s.size = sVar8;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = pcVar4;
        (this->super_Parser).s.size = sVar5;
        break;
      }
      pbVar3 = pbVar3 + 1;
    } while (sVar8 != 0);
  }
  local_f8.s = ")";
  local_f8.size = 1;
  fStack_94 = extraout_XMM0_Db_03;
  fStack_90 = extraout_XMM0_Dc_03;
  fStack_8c = extraout_XMM0_Dd_03;
  Parser::expect(&this->super_Parser,&local_f8);
  fVar13 = local_a8 * fStack_b0;
  fVar14 = local_a8 * fStack_ac;
  fVar11 = local_a8 * fStack_b0 + local_78 * local_c8;
  fVar12 = local_a8 * fStack_ac + local_78 * fStack_c4;
  fVar9 = local_e8 * fStack_b0 + local_d8 * local_c8;
  fVar10 = local_e8 * fStack_ac + local_d8 * fStack_c4;
  __return_storage_ptr__->a = fVar10;
  __return_storage_ptr__->b = fVar9;
  __return_storage_ptr__->c = fVar12;
  __return_storage_ptr__->d = fVar11;
  local_b8 = local_88 * fStack_b0 + local_98 * local_c8 + local_b8;
  fStack_b4 = local_88 * fStack_ac + local_98 * fStack_c4 + fStack_b4;
  __return_storage_ptr__->e = fStack_b4;
  __return_storage_ptr__->f = local_b8;
  fStack_b0 = fVar9;
  fStack_ac = fVar10;
  fStack_c0 = fVar13 + local_78 * fStack_c0;
  fStack_bc = fVar14 + local_78 * fStack_bc;
  goto LAB_0010883b;
  while (pbVar3 = pbVar3 + 1, sVar8 != 0) {
LAB_0010852d:
    sVar8 = sVar8 - 1;
    local_f8.s = (this->super_Parser).s.s;
    local_f8.size = (this->super_Parser).s.size;
    bVar1 = *pbVar3;
    (this->super_Parser).s.s = (char *)(pbVar3 + 1);
    (this->super_Parser).s.size = sVar8;
    if ((0x2c < (ulong)bVar1) || ((0x100100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      (this->super_Parser).s.s = local_f8.s;
      (this->super_Parser).s.size = local_f8.size;
      break;
    }
  }
LAB_0010855c:
  local_e8 = Parser::parse_number(&this->super_Parser);
  sVar8 = (this->super_Parser).s.size;
  auVar6._4_4_ = fStack_b4;
  auVar6._0_4_ = local_b8;
  auVar6._8_4_ = fStack_b0;
  auVar6._12_4_ = fStack_ac;
  if (sVar8 != 0) {
    pbVar3 = (byte *)(this->super_Parser).s.s;
    do {
      sVar8 = sVar8 - 1;
      local_f8.s = (this->super_Parser).s.s;
      local_f8.size = (this->super_Parser).s.size;
      bVar1 = *pbVar3;
      (this->super_Parser).s.s = (char *)(pbVar3 + 1);
      (this->super_Parser).s.size = sVar8;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = local_f8.s;
        (this->super_Parser).s.size = local_f8.size;
        break;
      }
      pbVar3 = pbVar3 + 1;
    } while (sVar8 != 0);
  }
  local_88 = local_c8 * 0.0;
  fStack_84 = fStack_c4 * 0.0;
  fStack_80 = fStack_c0 * 0.0;
  fStack_7c = fStack_bc * 0.0;
  fStack_60 = fStack_b0;
  local_68 = auVar6._8_8_;
  fStack_5c = fStack_ac;
  local_98 = fStack_b0 * 0.0 + local_c8;
  fStack_94 = fStack_ac * 0.0 + fStack_c4;
  fStack_90 = fStack_b0 * 0.0 + fStack_c0;
  fStack_8c = fStack_ac * 0.0 + fStack_bc;
  local_b8 = local_d8 * fStack_b0 + local_c8 * local_e8 + local_b8;
  fStack_b4 = local_d8 * fStack_ac + fStack_c4 * local_e8 + fStack_b4;
  fStack_b0 = local_d8 * fStack_b0 + fStack_c0 * local_e8 + fStack_b0;
  fStack_ac = local_d8 * fStack_ac + fStack_bc * local_e8 + fStack_ac;
  fStack_e4 = local_e8;
  fStack_e0 = local_e8;
  fStack_dc = local_e8;
  local_78 = local_98;
  fStack_74 = fStack_94;
  fStack_70 = local_98;
  fStack_6c = fStack_94;
  local_c8 = cosf(local_a8);
  fStack_c4 = extraout_XMM0_Db_08;
  fStack_c0 = extraout_XMM0_Dc_08;
  fStack_bc = extraout_XMM0_Dd_08;
  fVar11 = sinf(local_a8);
  fVar10 = (float)local_68._0_4_ + local_88;
  fVar13 = (float)local_68._4_4_ + fStack_84;
  fStack_d0 = local_c8 * fVar10 + fVar11 * local_98;
  fStack_cc = local_c8 * fVar13 + fVar11 * fStack_94;
  fVar12 = -fVar11 * fVar10 + local_c8 * fStack_70;
  fVar9 = -fVar11 * fVar13 + local_c8 * fStack_6c;
  fVar14 = fStack_d0 * 0.0 + fVar12;
  fVar15 = fStack_cc * 0.0 + fVar9;
  fStack_e0 = (local_c8 * (fStack_60 + fStack_80) + fVar11 * fStack_90) * 0.0 + fVar12;
  fStack_dc = (local_c8 * (fStack_5c + fStack_7c) + fVar11 * fStack_8c) * 0.0 + fVar9;
  fVar11 = -local_d8;
  local_d8 = (-local_d8 * fStack_d0 - fVar12 * local_e8) + local_b8 + fVar10 * 0.0 + local_78 * 0.0;
  fStack_d4 = (fVar11 * fStack_cc - fVar9 * fStack_e4) + fStack_b4 + fVar13 * 0.0 + fStack_74 * 0.0;
  fStack_d0 = fStack_d0 + fVar12 * 0.0;
  fStack_cc = fStack_cc + fVar9 * 0.0;
LAB_00108497:
  __return_storage_ptr__->a = fStack_cc;
  __return_storage_ptr__->b = fStack_d0;
  __return_storage_ptr__->c = fVar15;
  __return_storage_ptr__->d = fVar14;
  __return_storage_ptr__->e = fStack_d4;
  __return_storage_ptr__->f = local_d8;
  local_f8.s = ")";
  local_f8.size = 1;
  local_e8 = fVar14;
  fStack_e4 = fVar15;
  Parser::expect(&this->super_Parser,&local_f8);
  local_b8 = local_d8;
  fStack_b4 = fStack_d4;
  fStack_b0 = fStack_d0;
  fStack_ac = fStack_cc;
  fVar11 = local_e8;
  fVar12 = fStack_e4;
  fStack_c0 = fStack_e0;
  fStack_bc = fStack_dc;
  goto LAB_0010883b;
  while (pbVar3 = pbVar3 + 1, sVar8 != 0) {
LAB_0010833f:
    sVar8 = sVar8 - 1;
    pcVar4 = (this->super_Parser).s.s;
    sVar5 = (this->super_Parser).s.size;
    bVar1 = *pbVar3;
    (this->super_Parser).s.s = (char *)(pbVar3 + 1);
    (this->super_Parser).s.size = sVar8;
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      (this->super_Parser).s.s = pcVar4;
      (this->super_Parser).s.size = sVar5;
      break;
    }
  }
LAB_00108267:
  local_f8.s = ")";
  local_f8.size = 1;
  local_d8 = fVar10;
  fStack_d4 = fVar11;
  fStack_d0 = fVar12;
  fStack_cc = fVar9;
  Parser::expect(&this->super_Parser,&local_f8);
  fVar9 = fStack_b0 * 0.0;
  fVar10 = fStack_ac * 0.0;
  fVar11 = local_d8 * local_c8 + fStack_b0 * 0.0;
  fVar12 = local_d8 * fStack_c4 + fStack_ac * 0.0;
  local_b8 = fStack_b0 * 0.0 + local_c8 * 0.0 + local_b8;
  fStack_b4 = fStack_ac * 0.0 + fStack_c4 * 0.0 + fStack_b4;
  fStack_b0 = local_e8 * fStack_b0 + local_c8 * 0.0;
  fStack_ac = local_e8 * fStack_ac + fStack_c4 * 0.0;
  __return_storage_ptr__->a = fStack_ac;
  __return_storage_ptr__->b = fStack_b0;
  __return_storage_ptr__->c = fVar12;
  __return_storage_ptr__->d = fVar11;
  __return_storage_ptr__->e = fStack_b4;
  __return_storage_ptr__->f = local_b8;
  fStack_c0 = local_d8 * fStack_c0 + fVar9;
  fStack_bc = local_d8 * fStack_bc + fVar10;
  goto LAB_0010883b;
  while (pbVar3 = pbVar3 + 1, sVar8 != 0) {
LAB_00108177:
    sVar8 = sVar8 - 1;
    pcVar4 = (this->super_Parser).s.s;
    sVar5 = (this->super_Parser).s.size;
    bVar1 = *pbVar3;
    (this->super_Parser).s.s = (char *)(pbVar3 + 1);
    (this->super_Parser).s.size = sVar8;
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      (this->super_Parser).s.s = pcVar4;
      (this->super_Parser).s.size = sVar5;
      break;
    }
  }
LAB_00108049:
  local_f8.s = ")";
  local_f8.size = 1;
  local_d8 = fVar10;
  fStack_d4 = fVar11;
  fStack_d0 = fVar12;
  fStack_cc = fVar9;
  Parser::expect(&this->super_Parser,&local_f8);
  fVar9 = fStack_b0 * 0.0;
  fVar10 = fStack_ac * 0.0;
  fVar11 = fStack_b0 * 0.0 + local_c8;
  fVar12 = fStack_ac * 0.0 + fStack_c4;
  local_b8 = local_b8 + local_e8 * fStack_b0 + local_d8 * local_c8;
  fStack_b4 = fStack_b4 + local_e8 * fStack_ac + local_d8 * fStack_c4;
  fStack_b0 = fStack_b0 + local_c8 * 0.0;
  fStack_ac = fStack_ac + fStack_c4 * 0.0;
  __return_storage_ptr__->a = fStack_ac;
  __return_storage_ptr__->b = fStack_b0;
  __return_storage_ptr__->c = fVar12;
  __return_storage_ptr__->d = fVar11;
  __return_storage_ptr__->e = fStack_b4;
  __return_storage_ptr__->f = local_b8;
  fStack_c0 = fVar9 + fStack_c0;
  fStack_bc = fVar10 + fStack_bc;
LAB_0010883b:
  sVar8 = (this->super_Parser).s.size;
  if (sVar8 == 0) {
    return __return_storage_ptr__;
  }
  pbVar3 = (byte *)(this->super_Parser).s.s;
  while( true ) {
    sVar8 = sVar8 - 1;
    local_f8.s = (this->super_Parser).s.s;
    local_f8.size = (this->super_Parser).s.size;
    bVar1 = *pbVar3;
    (this->super_Parser).s.s = (char *)(pbVar3 + 1);
    (this->super_Parser).s.size = sVar8;
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
    pbVar3 = pbVar3 + 1;
    if (sVar8 == 0) {
      return __return_storage_ptr__;
    }
  }
  (this->super_Parser).s.s = local_f8.s;
  (this->super_Parser).s.size = local_f8.size;
  if ((this->super_Parser).s.size == 0) {
    return __return_storage_ptr__;
  }
  goto LAB_00107a8c;
}

Assistant:

Transformation parse() {
		Transformation t;
		parse_all(white_space);
		while (has_next()) {
			if (parse("matrix")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number();
				parse_all(white_space_or_comma);
				const float b = parse_number();
				parse_all(white_space_or_comma);
				const float c = parse_number();
				parse_all(white_space_or_comma);
				const float d = parse_number();
				parse_all(white_space_or_comma);
				const float e = parse_number();
				parse_all(white_space_or_comma);
				const float f = parse_number();
				parse_all(white_space);
				expect(")");
				t = t * Transformation(a, b, c, d, e, f);
			}
			else if (parse("translate")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float x = parse_number();
				parse_all(white_space_or_comma);
				float y = 0.f;
				if (copy().parse(number_start_char)) {
					y = parse_number();
					parse_all(white_space);
				}
				expect(")");
				t = t * Transformation::translate(x, y);
			}
			else if (parse("scale")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float x = parse_number();
				parse_all(white_space_or_comma);
				float y = x;
				if (copy().parse(number_start_char)) {
					y = parse_number();
					parse_all(white_space);
				}
				expect(")");
				t = t * Transformation::scale(x, y);
			}
			else if (parse("rotate")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				if (copy().parse(number_start_char)) {
					const float x = parse_number();
					parse_all(white_space_or_comma);
					const float y = parse_number();
					parse_all(white_space);
					t = t * Transformation::translate(x, y) * Transformation::rotate(a) * Transformation::translate(-x, -y);
				}
				else {
					t = t * Transformation::rotate(a);
				}
				expect(")");
			}
			else if (parse("skewX")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				expect(")");
				t = t * Transformation(1.f, 0.f, std::tan(a), 1.f, 0.f, 0.f);
			}
			else if (parse("skewY")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				expect(")");
				t = t * Transformation(1.f, std::tan(a), 0.f, 1.f, 0.f, 0.f);
			}
			else {
				error("unexpected transformation");
			}
			parse_all(white_space);
		}
		return t;
	}